

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

void __thiscall zsummer::log4z::CLogerManager::Run(CLogerManager *this)

{
  int iVar1;
  char *__s;
  bool bVar2;
  ostream *poVar3;
  size_t len;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  CLog4zFile *pCVar7;
  string *psVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  long lVar13;
  LoggerInfo *pLVar14;
  LogData *pLog;
  char *local_250;
  LoggerInfo *local_248;
  CLog4zFile *local_240;
  _List_node_base *local_238;
  CLog4zFile *local_230;
  time_t local_228;
  time_t local_220;
  int needFlush [10];
  tm tm2;
  stringstream ss;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  char *local_188;
  
  this->m_bRuning = true;
  psVar8 = (string *)this->m_loggers;
  this->m_loggers[0]._enable = true;
  (*(this->super_CThread)._vptr_CThread[8])
            (this,0,4,"-----------------  log thread runing...   ----------------------------");
  local_248 = (LoggerInfo *)psVar8;
  for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 1) {
    if (psVar8[0x6c] == (string)0x1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<((ostream *)local_1a8," logger id=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar13);
      poVar3 = std::operator<<(poVar3," path=");
      poVar3 = std::operator<<(poVar3,psVar8 + 0x40);
      poVar3 = std::operator<<(poVar3," name=");
      poVar3 = std::operator<<(poVar3,psVar8);
      poVar3 = std::operator<<(poVar3," level=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(psVar8 + 0x60));
      poVar3 = std::operator<<(poVar3," display=");
      std::ostream::_M_insert<bool>(SUB81(poVar3,0));
      std::__cxx11::stringbuf::str();
      (*(this->super_CThread)._vptr_CThread[8])(this,0,4,tm2._0_8_);
      std::__cxx11::string::~string((string *)&tm2);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    psVar8 = psVar8 + 0x88;
  }
  CSem::Post(&this->m_semaphore);
  pLog = (LogData *)0x0;
  local_250 = (char *)operator_new__(0xa00);
  needFlush[4] = 0;
  needFlush[5] = 0;
  needFlush[6] = 0;
  needFlush[7] = 0;
  needFlush[0] = 0;
  needFlush[1] = 0;
  needFlush[2] = 0;
  needFlush[3] = 0;
  needFlush[8] = 0;
  needFlush[9] = 0;
  local_238 = (_List_node_base *)&this->m_logs;
  local_230 = &this->m_loggers[0]._handle;
  pLVar14 = local_248;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar2 = PopLog(this,&pLog);
          if (bVar2) break;
          pCVar7 = local_230;
          for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 1) {
            if ((*(bool *)((long)(pCVar7 + -3) + 4) == true) && (0 < needFlush[lVar13])) {
              CLog4zFile::Flush(pCVar7);
              needFlush[lVar13] = 0;
            }
            pCVar7 = pCVar7 + 0x11;
          }
          if ((this->m_bRuning == false) &&
             ((this->m_logs).
              super__List_base<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>
              ._M_impl._M_node.super__List_node_base._M_next == local_238)) {
            pCVar7 = &this->m_loggers[0]._handle;
            lVar13 = 10;
            while (bVar2 = lVar13 != 0, lVar13 = lVar13 + -1, bVar2) {
              if (*(bool *)((long)(pCVar7 + -3) + 4) == true) {
                *(bool *)((long)(pCVar7 + -3) + 4) = false;
                CLog4zFile::Close(pCVar7);
              }
              pCVar7 = pCVar7 + 0x11;
            }
            operator_delete__(local_250);
            return;
          }
          usleep(100000);
        }
        this->m_ullStatusTotalPopLog = this->m_ullStatusTotalPopLog + 1;
        iVar1 = pLog->_id;
        if ((pLVar14[iVar1]._enable == true) && (pLVar14[iVar1]._level <= pLog->_level)) break;
        operator_delete(pLog,0x818);
        pLog = (LogData *)0x0;
      }
      local_220 = pLog->_time;
      local_228 = pLVar14[iVar1]._curFileCreateTime;
      TimeToTm(&local_220,(tm *)&ss);
      TimeToTm(&local_228,&tm2);
      if ((local_1a8._4_4_ != tm2.tm_year) || (bVar2 = true, local_1a8._12_4_ != tm2.tm_yday)) {
        bVar2 = false;
      }
      uVar4 = pLVar14[iVar1]._limitsize << 0x14;
      if ((bool)(bVar2 ^ 1U | pLVar14[iVar1]._handle.m_file == (FILE *)0x0 |
                uVar4 < pLVar14[iVar1]._curWriteLen)) break;
LAB_0011acd4:
      bVar2 = TimeToTm(&pLog->_time,(tm *)&ss);
      __s = local_250;
      if (bVar2) {
        uVar9 = (ulong)uStack_1ac;
        uVar10 = (ulong)uStack_1b0;
        uVar11 = (ulong)_ss;
        uVar12 = (ulong)uStack_1b4;
        uVar6 = (ulong)(local_1a8._4_4_ + 0x76c);
        uVar5 = (ulong)(local_1a8._0_4_ + 1);
      }
      else {
        local_198 = (undefined1  [16])0x0;
        local_188 = (char *)0x0;
        local_1a8 = (undefined1  [16])0x0;
        _ss = (undefined1  [16])0x0;
        uVar6 = 0x76c;
        uVar11 = 0;
        uVar12 = 0;
        uVar10 = 0;
        uVar9 = 0;
        uVar5 = 1;
      }
      local_240 = &pLVar14[iVar1]._handle;
      sprintf(local_250,"%d-%02d-%02d %02d:%02d:%02d.%03d %s %s \r\n",uVar6,uVar5,uVar9,uVar10,
              uVar12,uVar11,(ulong)pLog->_precise,
              *(undefined8 *)(LOG_STRING + (long)pLog->_level * 8),pLog->_content);
      len = strlen(__s);
      CLog4zFile::Write(local_240,__s,len);
      pLVar14[iVar1]._curWriteLen = pLVar14[iVar1]._curWriteLen + (int)len;
      needFlush[pLog->_id] = needFlush[pLog->_id] + 1;
      this->m_ullStatusTotalWriteFileCount = this->m_ullStatusTotalWriteFileCount + 1;
      this->m_ullStatusTotalWriteFileBytes = len + this->m_ullStatusTotalWriteFileBytes;
      operator_delete(pLog,0x818);
      pLog = (LogData *)0x0;
      pLVar14 = local_248;
    }
    if (bVar2) {
      if (uVar4 < pLVar14[iVar1]._curWriteLen) {
        pLVar14[iVar1]._curFileIndex = pLVar14[iVar1]._curFileIndex + 1;
        goto LAB_0011acb1;
      }
    }
    else {
      pLVar14[iVar1]._curFileIndex = 0;
LAB_0011acb1:
      pLVar14[iVar1]._curWriteLen = 0;
    }
    pLVar14[iVar1]._curFileCreateTime = pLog->_time;
    bVar2 = OpenLogger(this,pLog->_id);
    if (bVar2) goto LAB_0011acd4;
    pLVar14[iVar1]._enable = false;
    operator_delete(pLog,0x818);
    pLog = (LogData *)0x0;
    ShowColorText("log4z: Run can not update file, open file false! \r\n",5);
  } while( true );
}

Assistant:

virtual void Run()
	{
		m_bRuning = true;
		m_loggers[LOG4Z_MAIN_LOGGER_ID]._enable = true;
		PushLog(0, LOG_LEVEL_ALARM, "-----------------  log thread runing...   ----------------------------");
		for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
		{
			if (m_loggers[i]._enable)
			{
				std::stringstream ss;
				ss <<" logger id=" <<i
				   <<" path=" <<m_loggers[i]._path
				   <<" name=" <<m_loggers[i]._name
				   <<" level=" << m_loggers[i]._level
				   <<" display=" << m_loggers[i]._display;
				PushLog(0, LOG_LEVEL_ALARM, ss.str().c_str());
			}
		}

		m_semaphore.Post();


		LogData * pLog = NULL;
		char *pWriteBuf = new char[LOG4Z_LOG_BUF_SIZE + 512];
		int needFlush[LOG4Z_LOGGER_MAX] = {0};
		while (true)
		{
			while(PopLog(pLog))
			{
				//
				m_ullStatusTotalPopLog ++;
				//discard
				LoggerInfo & curLogger = m_loggers[pLog->_id];
				if (!curLogger._enable || pLog->_level <curLogger._level  )
				{
					delete pLog;
					pLog = NULL;
					continue;
				}

				//update file
				if (LOG4Z_WRITE_TO_FILE)
				{
					bool sameday = IsSameDay(pLog->_time, curLogger._curFileCreateTime);
					bool needChageFile = curLogger._curWriteLen > curLogger._limitsize*1024*1024;
					if (!curLogger._handle.IsOpen()
						|| !sameday
						|| needChageFile)
					{
						if (!sameday)
						{
							curLogger._curFileIndex = 0;
							curLogger._curWriteLen = 0;
						}
						else if ( needChageFile)
						{
							curLogger._curFileIndex ++;
							curLogger._curWriteLen = 0;
						}
						curLogger._curFileCreateTime = pLog->_time;
						if (!OpenLogger(pLog->_id))
						{
							curLogger._enable = false;
							delete pLog;
							pLog = NULL;
							ShowColorText("log4z: Run can not update file, open file false! \r\n", LOG_LEVEL_FATAL);
							continue;
						}
					}
				}

				//record
				tm tt;
				if (!TimeToTm(pLog->_time, &tt))
				{
					memset(&tt, 0, sizeof(tt));
				}
				sprintf(pWriteBuf, "%d-%02d-%02d %02d:%02d:%02d.%03d %s %s \r\n",
					tt.tm_year+1900, tt.tm_mon+1, tt.tm_mday, tt.tm_hour, tt.tm_min, tt.tm_sec, pLog->_precise,
					LOG_STRING[pLog->_level], pLog->_content);

				if (LOG4Z_WRITE_TO_FILE)
				{
					size_t writeLen = strlen(pWriteBuf);
					curLogger._handle.Write(pWriteBuf, writeLen);
					curLogger._curWriteLen += (unsigned int)writeLen;
					needFlush[pLog->_id] ++;
					m_ullStatusTotalWriteFileCount++;
					m_ullStatusTotalWriteFileBytes += writeLen;
				}
				else
				{
					size_t writeLen = strlen(pWriteBuf);
					m_ullStatusTotalWriteFileCount++;
					m_ullStatusTotalWriteFileBytes += writeLen;
				}

				if (curLogger._display && !LOG4Z_SYNCHRONOUS_DISPLAY)
				{
					ShowColorText(pWriteBuf, pLog->_level);
				}



				delete pLog;
				pLog = NULL;
			}

			for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
			{
				if (m_loggers[i]._enable && needFlush[i] > 0)
				{
					m_loggers[i]._handle.Flush();
					needFlush[i] = 0;
				}
			}

			//! quit
			if (!m_bRuning && m_logs.empty())
			{
				break;
			}
			//! delay.
			SleepMillisecond(100);
		}

		for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
		{
			if (m_loggers[i]._enable)
			{
				m_loggers[i]._enable = false;
				m_loggers[i]._handle.Close();
			}
		}
		delete []pWriteBuf;
		pWriteBuf = NULL;

	}